

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall libtorrent::tracker_alert::~tracker_alert(tracker_alert *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

struct TORRENT_EXPORT tracker_alert : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT tracker_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& ep, protocol_version v, string_view u);

#if TORRENT_ABI_VERSION == 1
		TORRENT_DEPRECATED static int const alert_type = 2;
#endif

		std::string message() const override;

		// endpoint of the listen interface being announced
		aux::noexcept_movable<tcp::endpoint> local_endpoint;

		// returns a 0-terminated string of the tracker's URL
		char const* tracker_url() const;

	private:
		aux::allocation_slot m_url_idx;
	public:
		// the bittorrent protocol version that was announced
		protocol_version version;
#if TORRENT_ABI_VERSION == 1
		// The tracker URL
		TORRENT_DEPRECATED std::string url;
#endif
	}